

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_test.cc
# Opt level: O2

void __thiscall DHTest_InvalidParameters_Test::TestBody(DHTest_InvalidParameters_Test *this)

{
  int iVar1;
  DH *pDVar2;
  _Alloc_hider _Var3;
  char *in_R9;
  AssertHelper local_78;
  UniquePtr<BIGNUM> large;
  UniquePtr<DH> dh;
  AssertHelper local_60;
  UniquePtr<BIGNUM> g;
  string local_50;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> p;
  
  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       BN_get_rfc3526_prime_2048((BIGNUM *)0x0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)
       p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_st_*,_false>)0x0;
  if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&g);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dh,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x1b8,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dh,(Message *)&g);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dh);
    std::__cxx11::string::~string((string *)&local_50);
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00234b0d;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)
       g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_st_*,_false>)0x0;
  if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
      g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&dh);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4c1f32,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&large,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x1ba,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&large,(Message *)&dh);
LAB_002347f0:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&large);
    std::__cxx11::string::~string((string *)&local_50);
    if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
        dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = BN_set_word((BIGNUM *)
                        g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,2);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&dh);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,(AssertionResult *)"BN_set_word(g.get(), 2)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&large,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x1bb,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&large,(Message *)&dh);
      goto LAB_002347f0;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    BN_set_negative((BIGNUM *)
                    p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
    NewDHGroup((BIGNUM *)&dh,
               (BIGNUM *)
               p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)0x0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
         dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
        dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&large);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4ada24,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x1c0,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&large);
LAB_0023492d:
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
          large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pDVar2 = (DH *)0x0;
      BN_set_negative((BIGNUM *)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,pDVar2);
      BN_set_negative((BIGNUM *)
                      g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
      NewDHGroup((BIGNUM *)&local_50,
                 (BIGNUM *)
                 p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)0x0);
      _Var3._M_p = local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter> *)&dh,(pointer)_Var3._M_p);
      std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&local_50);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
           dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
          dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&large);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4ada24,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1c7,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&large);
        goto LAB_0023492d;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pDVar2 = (DH *)0x0;
      BN_set_negative((BIGNUM *)
                      g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,pDVar2);
      NewDHGroup((BIGNUM *)&local_50,
                 (BIGNUM *)
                 p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)0x0);
      _Var3._M_p = local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter> *)&dh,(pointer)_Var3._M_p);
      std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&local_50);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
           dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
          dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&large);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4ada24,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1cd,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&large);
        goto LAB_0023492d;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pDVar2 = (DH *)0x0;
      BN_set_negative((BIGNUM *)
                      g._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0);
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,pDVar2);
      large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
      iVar1 = BN_set_bit((BIGNUM *)
                         large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)"BN_set_bit(large.get(), 0)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1d3,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
LAB_00234ac4:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&local_50);
        if (local_78.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = BN_set_bit((BIGNUM *)
                           large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,10000000);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,
                     (AssertionResult *)"BN_set_bit(large.get(), 10000000)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1d4,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          goto LAB_00234ac4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        NewDHGroup((BIGNUM *)&local_50,
                   (BIGNUM *)
                   large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)0x0);
        _Var3._M_p = local_50._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter> *)&dh,(pointer)_Var3._M_p);
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&local_50);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
             dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
            dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4ada24,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1d6,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          goto LAB_00234ac4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)
                   dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,(DH *)_Var3._M_p);
        NewDHGroup((BIGNUM *)&local_50,
                   (BIGNUM *)
                   p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                   (BIGNUM *)
                   large._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
        _Var3._M_p = local_50._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter> *)&dh,(pointer)_Var3._M_p);
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&local_50);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
             dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)
            dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4ada24,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1db,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          goto LAB_00234ac4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)
                   dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,(DH *)_Var3._M_p);
        iVar1 = DH_generate_parameters_ex
                          ((DH *)dh._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,20000,5,
                           (BN_GENCB *)0x0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,
                     (AssertionResult *)"DH_generate_parameters_ex(dh.get(), 20000, 5, nullptr)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1e0,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          goto LAB_00234ac4;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&large);
    }
    std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&dh);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&g);
LAB_00234b0d:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&p);
  return;
}

Assistant:

TEST(DHTest, InvalidParameters) {
  auto check_invalid_group = [](DH *dh) {
    // All operations on egregiously invalid groups should fail.
    EXPECT_FALSE(DH_generate_key(dh));
    int check_result;
    EXPECT_FALSE(DH_check(dh, &check_result));
    bssl::UniquePtr<BIGNUM> pub_key(BN_new());
    ASSERT_TRUE(pub_key);
    ASSERT_TRUE(BN_set_u64(pub_key.get(), 42));
    EXPECT_FALSE(DH_check_pub_key(dh, pub_key.get(), &check_result));
    uint8_t buf[1024];
    EXPECT_EQ(DH_compute_key(buf, pub_key.get(), dh), -1);
    EXPECT_EQ(DH_compute_key_padded(buf, pub_key.get(), dh), -1);
  };

  bssl::UniquePtr<BIGNUM> p(BN_get_rfc3526_prime_2048(nullptr));
  ASSERT_TRUE(p);
  bssl::UniquePtr<BIGNUM> g(BN_new());
  ASSERT_TRUE(g);
  ASSERT_TRUE(BN_set_word(g.get(), 2));

  // p is negative.
  BN_set_negative(p.get(), 1);
  bssl::UniquePtr<DH> dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(p.get(), 0);
  check_invalid_group(dh.get());

  // g is negative.
  BN_set_negative(g.get(), 1);
  dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // g is not reduced mod p.
  dh = NewDHGroup(p.get(), /*q=*/nullptr, p.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // p is too large.
  bssl::UniquePtr<BIGNUM> large(BN_new());
  ASSERT_TRUE(BN_set_bit(large.get(), 0));
  ASSERT_TRUE(BN_set_bit(large.get(), 10000000));
  dh = NewDHGroup(large.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // q is too large.
  dh = NewDHGroup(p.get(), large.get(), g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // Attempting to generate too large of a Diffie-Hellman group should fail.
  EXPECT_FALSE(
      DH_generate_parameters_ex(dh.get(), 20000, DH_GENERATOR_5, nullptr));
}